

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyDrawIndexedIndirectAttribs(DrawIndexedIndirectAttribs *Attribs)

{
  IBuffer *pIVar1;
  int iVar2;
  BIND_FLAGS BVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  char (*in_RCX) [46];
  char (*in_R9) [53];
  char (*in_stack_fffffffffffffe50) [7];
  uint local_18c;
  undefined1 local_158 [8];
  string msg_7;
  Uint64 ReqCountBufSize;
  string msg_6;
  BufferDesc *CntBuffDesc;
  string msg_5;
  Uint64 ReqAttrBufSize;
  string msg_4;
  string msg_3;
  string msg_2;
  BufferDesc *AttrBuffDesc;
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  IBuffer *pCounterBuffer;
  IBuffer *pAttribsBuffer;
  DrawIndexedIndirectAttribs *Attribs_local;
  char (*Args_3) [53];
  
  pIVar1 = Attribs->pAttribsBuffer;
  msg.field_2._8_8_ = Attribs->pCounterBuffer;
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[44],char[46]>
              ((string *)local_40,(Diligent *)"Draw indexed indirect attribs are invalid: ",
               (char (*) [44])"indirect draw arguments buffer must not null.",in_RCX);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [46])0x9b;
    DebugAssertionFailed
              (pCVar4,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x9b);
    std::__cxx11::string::~string((string *)local_40);
  }
  if ((Attribs->IndexType != VT_UINT16) && (Attribs->IndexType != VT_UINT32)) {
    AttrBuffDesc = (BufferDesc *)GetValueTypeString(Attribs->IndexType);
    FormatString<char[44],char[12],char_const*,char[34]>
              ((string *)local_70,(Diligent *)"Draw indexed indirect attribs are invalid: ",
               (char (*) [44])0x486fd4,(char (*) [12])&AttrBuffDesc,
               (char **)") must be VT_UINT16 or VT_UINT32.",(char (*) [34])in_R9);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [46])0x9d;
    DebugAssertionFailed
              (pCVar4,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x9d);
    std::__cxx11::string::~string((string *)local_70);
  }
  iVar2 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  Args_3 = (char (*) [53])CONCAT44(extraout_var,iVar2);
  BVar3 = operator&(*(BIND_FLAGS *)(*Args_3 + 0x10),BIND_INDIRECT_DRAW_ARGS);
  if (BVar3 == BIND_NONE) {
    FormatString<char[44],char[33],char_const*,char[53]>
              ((string *)((long)&msg_3.field_2 + 8),
               (Diligent *)"Draw indexed indirect attribs are invalid: ",(char (*) [44])0x485cfc,
               (char (*) [33])Args_3,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [46])0xa0;
    DebugAssertionFailed
              (pCVar4,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xa0);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if (1 < Attribs->DrawCount) {
    if (Attribs->DrawArgsStride < 0x14) {
      FormatString<char[44],char[37]>
                ((string *)((long)&msg_4.field_2 + 8),
                 (Diligent *)"Draw indexed indirect attribs are invalid: ",
                 (char (*) [44])"stride must be greater than 20 bytes",(char (*) [37])in_RCX);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [46])0xa4;
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xa4);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    if ((Attribs->DrawArgsStride & 3) != 0) {
      FormatString<char[44],char[31]>
                ((string *)&ReqAttrBufSize,(Diligent *)"Draw indexed indirect attribs are invalid: "
                 ,(char (*) [44])"stride must be a multiple of 4",(char (*) [31])in_RCX);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xa5);
      std::__cxx11::string::~string((string *)&ReqAttrBufSize);
    }
  }
  if (Attribs->DrawCount < 2) {
    local_18c = 0x14;
  }
  else {
    local_18c = Attribs->DrawCount * Attribs->DrawArgsStride;
  }
  msg_5.field_2._8_8_ = Attribs->DrawArgsOffset + (ulong)local_18c;
  if (*(ulong *)(*Args_3 + 8) < (ulong)msg_5.field_2._8_8_) {
    FormatString<char[44],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
              ((string *)&CntBuffDesc,(Diligent *)"Draw indexed indirect attribs are invalid: ",
               (char (*) [44])"invalid DrawArgsOffset (",(char (*) [25])&Attribs->DrawArgsOffset,
               (unsigned_long *)") or indirect draw arguments buffer \'",(char (*) [38])Args_3,
               (char **)"\' size must be at least ",(char (*) [25])((long)&msg_5.field_2 + 8),
               (unsigned_long *)0x485e17,in_stack_fffffffffffffe50);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xaa);
    std::__cxx11::string::~string((string *)&CntBuffDesc);
    in_R9 = Args_3;
  }
  if (msg.field_2._8_8_ != 0) {
    msg_6.field_2._8_8_ = (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
    BVar3 = operator&(*(BIND_FLAGS *)(msg_6.field_2._8_8_ + 0x10),BIND_INDIRECT_DRAW_ARGS);
    if (BVar3 == BIND_NONE) {
      FormatString<char[44],char[26],char_const*,char[53]>
                ((string *)&ReqCountBufSize,
                 (Diligent *)"Draw indexed indirect attribs are invalid: ",
                 (char (*) [44])"indirect counter buffer \'",(char (*) [26])msg_6.field_2._8_8_,
                 (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xb0);
      std::__cxx11::string::~string((string *)&ReqCountBufSize);
    }
    msg_7.field_2._8_8_ = Attribs->CounterOffset + 4;
    if (*(ulong *)(msg_6.field_2._8_8_ + 8) < (ulong)msg_7.field_2._8_8_) {
      FormatString<char[44],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
                ((string *)local_158,(Diligent *)"Draw indexed indirect attribs are invalid: ",
                 (char (*) [44])"invalid CounterOffset (",(char (*) [24])&Attribs->CounterOffset,
                 (unsigned_long *)") or counter buffer \'",(char (*) [22])msg_6.field_2._8_8_,
                 (char **)"\' size must be at least ",(char (*) [25])((long)&msg_7.field_2 + 8),
                 (unsigned_long *)0x485e17,in_stack_fffffffffffffe50);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xb3);
      std::__cxx11::string::~string((string *)local_158);
    }
  }
  return true;
}

Assistant:

bool VerifyDrawIndexedIndirectAttribs(const DrawIndexedIndirectAttribs& Attribs)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;
    const IBuffer* pCounterBuffer = Attribs.pCounterBuffer;

#define CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw indexed indirect attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect draw arguments buffer must not null.");
    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Attribs.IndexType == VT_UINT16 || Attribs.IndexType == VT_UINT32,
                                        "IndexType (", GetValueTypeString(Attribs.IndexType), ") must be VT_UINT16 or VT_UINT32.");
    const BufferDesc& AttrBuffDesc = pAttribsBuffer->GetDesc();
    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS((AttrBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                        "indirect draw arguments buffer '", AttrBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");

    if (Attribs.DrawCount > 1)
    {
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Attribs.DrawArgsStride >= sizeof(Uint32) * 5, "stride must be greater than 20 bytes");
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Attribs.DrawArgsStride % 4 == 0, "stride must be a multiple of 4");
    }

    const Uint64 ReqAttrBufSize = Attribs.DrawArgsOffset + (Attribs.DrawCount > 1 ? Attribs.DrawCount * Attribs.DrawArgsStride : Uint32{sizeof(Uint32)} * 5);
    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(ReqAttrBufSize <= AttrBuffDesc.Size, "invalid DrawArgsOffset (", Attribs.DrawArgsOffset,
                                        ") or indirect draw arguments buffer '", AttrBuffDesc.Name, "' size must be at least ", ReqAttrBufSize, " bytes");

    if (pCounterBuffer != nullptr)
    {
        const BufferDesc& CntBuffDesc = pCounterBuffer->GetDesc();
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS((CntBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0, "indirect counter buffer '",
                                            CntBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
        const Uint64 ReqCountBufSize = Attribs.CounterOffset + sizeof(Uint32);
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(ReqCountBufSize <= CntBuffDesc.Size, "invalid CounterOffset (", Attribs.CounterOffset,
                                            ") or counter buffer '", CntBuffDesc.Name, "' size must be at least ", ReqCountBufSize, " bytes");
    }

#undef CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS

    return true;
}